

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack22_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [32];
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar13 [32];
  
  auVar7 = *(undefined1 (*) [16])(in + 1);
  auVar8 = vpmovsxbd_avx2(ZEXT816(0x3030201010008));
  uVar2 = *in;
  uVar1 = *(ulong *)(in + 5);
  auVar4 = vpsllvd_avx2(auVar7,_DAT_00199970);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar6 = vpsllvd_avx2(auVar16,_DAT_001a6990);
  auVar4 = vpand_avx(auVar4,_DAT_00199980);
  auVar5._8_8_ = 0x3f0000003fffc0;
  auVar5._0_8_ = 0x3f0000003fffc0;
  auVar6 = vpandq_avx512vl(auVar6,auVar5);
  *out = uVar2 & 0x3fffff;
  uVar3 = *(ulong *)(in + 9);
  auVar8 = vpermi2d_avx512vl(auVar8,ZEXT1632(auVar7),ZEXT432(uVar2));
  uVar15 = (undefined4)uVar1;
  auVar10._4_4_ = uVar15;
  auVar10._0_4_ = uVar15;
  auVar10._8_4_ = uVar15;
  auVar10._12_4_ = uVar15;
  auVar10._16_4_ = uVar15;
  auVar10._20_4_ = uVar15;
  auVar10._24_4_ = uVar15;
  auVar10._28_4_ = uVar15;
  auVar11._8_4_ = 0x3fffff;
  auVar11._0_8_ = 0x3fffff003fffff;
  auVar11._12_4_ = 0x3fffff;
  auVar13._16_4_ = 0x3fffff;
  auVar13._0_16_ = auVar11;
  auVar13._20_4_ = 0x3fffff;
  auVar13._24_4_ = 0x3fffff;
  auVar13._28_4_ = 0x3fffff;
  auVar7 = vshufps_avx(auVar4,auVar6,0x47);
  auVar4 = vshufps_avx(auVar4,auVar4,0xa4);
  auVar14._16_16_ = auVar7;
  auVar14._0_16_ = auVar4;
  auVar8 = vpblendd_avx2(auVar8,auVar10,0x80);
  auVar8 = vpsrlvd_avx2(auVar8,_DAT_001965a0);
  auVar10 = vpor_avx2(auVar8,auVar14);
  auVar8 = vpand_avx2(auVar8,auVar13);
  auVar8 = vpblendd_avx2(auVar10,auVar8,0x24);
  *(undefined1 (*) [32])(out + 1) = auVar8;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(in + 7);
  auVar7 = vshufps_avx(auVar16,auVar9,0x45);
  auVar4 = vpsrlvd_avx2(auVar7,_DAT_00199990);
  auVar7 = vshufps_avx(auVar9,auVar9,0x50);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001a69b0);
  auVar6 = vpternlogd_avx512vl(auVar7,auVar4,_DAT_001a69c0,0xec);
  auVar7 = vpand_avx(auVar4,auVar11);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar7 = vpblendd_avx2(auVar7,auVar6,6);
  *(undefined1 (*) [16])(out + 9) = auVar7;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar7 = vpermi2d_avx512vl(auVar4,auVar9,auVar12);
  auVar4 = vpsrlvd_avx2(auVar7,_DAT_001a69d0);
  auVar7 = vpsllvd_avx2(auVar12,_DAT_0019bb00);
  auVar6._8_8_ = 0x3ff000003ffffc;
  auVar6._0_8_ = 0x3ff000003ffffc;
  auVar7 = vpternlogq_avx512vl(auVar7,auVar4,auVar6,0xec);
  *(long *)(out + 0xd) = auVar7._0_8_;
  out[0xf] = (uint)(uVar3 >> 0x2a);
  return in + 0xb;
}

Assistant:

const uint32_t *__fastunpack22_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 6)) << (22 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 22);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 18)) << (22 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 8)) << (22 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 22);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 20)) << (22 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 10)) << (22 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  out++;

  return in;
}